

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

opj_tgt_tree_t *
opj_tgt_create(OPJ_UINT32 numleafsh,OPJ_UINT32 numleafsv,opj_event_mgr_t *p_manager)

{
  opj_tgt_node *poVar1;
  opj_tgt_tree_t *p_tree;
  opj_tgt_node_t *poVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  opj_tgt_node *poVar6;
  uint uVar7;
  opj_tgt_node *poVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  OPJ_INT32 nplv [32];
  OPJ_INT32 nplh [32];
  
  uVar4 = (ulong)numleafsv;
  p_tree = (opj_tgt_tree_t *)opj_calloc(1,0x20);
  if (p_tree == (opj_tgt_tree_t *)0x0) {
    opj_event_msg(p_manager,1,"Not enough memory to create Tag-tree\n");
  }
  else {
    p_tree->numleafsh = numleafsh;
    p_tree->numleafsv = numleafsv;
    uVar3 = 0;
    uVar11 = 0xffffffffffffffff;
    nplv[0] = numleafsv;
    nplh[0] = numleafsh;
    do {
      uVar7 = (int)uVar4 * numleafsh;
      numleafsh = (int)(numleafsh + 1) / 2;
      uVar9 = (int)uVar11 + 2;
      nplh[uVar9] = numleafsh;
      uVar4 = (long)((int)uVar4 + 1) / 2;
      nplv[uVar9] = (OPJ_INT32)uVar4;
      uVar3 = uVar3 + uVar7;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (1 < uVar7);
    p_tree->numnodes = uVar3;
    if (uVar3 != 0) {
      poVar2 = (opj_tgt_node_t *)opj_calloc((ulong)uVar3,0x18);
      p_tree->nodes = poVar2;
      if (poVar2 != (opj_tgt_node_t *)0x0) {
        p_tree->nodes_size = p_tree->numnodes * 0x18;
        poVar6 = poVar2 + p_tree->numleafsv * p_tree->numleafsh;
        poVar8 = poVar6;
        for (uVar4 = 0; uVar4 != uVar11; uVar4 = uVar4 + 1) {
          uVar3 = nplv[uVar4];
          uVar9 = 0;
          uVar7 = uVar3;
          if ((int)uVar3 < 1) {
            uVar7 = uVar9;
          }
          for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
            iVar5 = nplh[uVar4];
            lVar10 = (long)iVar5;
            for (; 0 < iVar5; iVar5 = iVar5 + -2) {
              poVar2->parent = poVar6;
              if (iVar5 == 1) {
                poVar2 = poVar2 + 1;
              }
              else {
                poVar2[1].parent = poVar6;
                poVar2 = poVar2 + 2;
              }
              poVar6 = poVar6 + 1;
            }
            poVar1 = poVar8 + lVar10;
            if (uVar9 == uVar3 - 1 || (uVar9 & 1) != 0) {
              poVar1 = poVar6;
              poVar8 = poVar6;
            }
            poVar6 = poVar8;
            poVar8 = poVar1;
          }
        }
        poVar2->parent = (opj_tgt_node *)0x0;
        opj_tgt_reset(p_tree);
        return p_tree;
      }
      opj_event_msg(p_manager,1,"Not enough memory to create Tag-tree nodes\n");
    }
    opj_free(p_tree);
  }
  return (opj_tgt_tree_t *)0x0;
}

Assistant:

opj_tgt_tree_t *opj_tgt_create(OPJ_UINT32 numleafsh, OPJ_UINT32 numleafsv,
                               opj_event_mgr_t *p_manager)
{
    OPJ_INT32 nplh[32];
    OPJ_INT32 nplv[32];
    opj_tgt_node_t *node = 00;
    opj_tgt_node_t *l_parent_node = 00;
    opj_tgt_node_t *l_parent_node0 = 00;
    opj_tgt_tree_t *tree = 00;
    OPJ_UINT32 i;
    OPJ_INT32  j, k;
    OPJ_UINT32 numlvls;
    OPJ_UINT32 n;

    tree = (opj_tgt_tree_t *) opj_calloc(1, sizeof(opj_tgt_tree_t));
    if (!tree) {
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to create Tag-tree\n");
        return 00;
    }

    tree->numleafsh = numleafsh;
    tree->numleafsv = numleafsv;

    numlvls = 0;
    nplh[0] = (OPJ_INT32)numleafsh;
    nplv[0] = (OPJ_INT32)numleafsv;
    tree->numnodes = 0;
    do {
        n = (OPJ_UINT32)(nplh[numlvls] * nplv[numlvls]);
        nplh[numlvls + 1] = (nplh[numlvls] + 1) / 2;
        nplv[numlvls + 1] = (nplv[numlvls] + 1) / 2;
        tree->numnodes += n;
        ++numlvls;
    } while (n > 1);

    /* ADD */
    if (tree->numnodes == 0) {
        opj_free(tree);
        return 00;
    }

    tree->nodes = (opj_tgt_node_t*) opj_calloc(tree->numnodes,
                  sizeof(opj_tgt_node_t));
    if (!tree->nodes) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory to create Tag-tree nodes\n");
        opj_free(tree);
        return 00;
    }
    tree->nodes_size = tree->numnodes * (OPJ_UINT32)sizeof(opj_tgt_node_t);

    node = tree->nodes;
    l_parent_node = &tree->nodes[tree->numleafsh * tree->numleafsv];
    l_parent_node0 = l_parent_node;

    for (i = 0; i < numlvls - 1; ++i) {
        for (j = 0; j < nplv[i]; ++j) {
            k = nplh[i];
            while (--k >= 0) {
                node->parent = l_parent_node;
                ++node;
                if (--k >= 0) {
                    node->parent = l_parent_node;
                    ++node;
                }
                ++l_parent_node;
            }
            if ((j & 1) || j == nplv[i] - 1) {
                l_parent_node0 = l_parent_node;
            } else {
                l_parent_node = l_parent_node0;
                l_parent_node0 += nplh[i];
            }
        }
    }
    node->parent = 0;
    opj_tgt_reset(tree);
    return tree;
}